

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

void __thiscall cmCTestScriptHandler::RestoreBackupDirectories(cmCTestScriptHandler *this)

{
  bool bVar1;
  
  if (this->Backup == true) {
    bVar1 = cmsys::SystemTools::FileExists(&this->SourceDir);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory(&this->SourceDir);
    }
    bVar1 = cmsys::SystemTools::FileExists(&this->BinaryDir);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory(&this->BinaryDir);
    }
    rename((this->BackupSourceDir)._M_dataplus._M_p,(this->SourceDir)._M_dataplus._M_p);
    rename((this->BackupBinaryDir)._M_dataplus._M_p,(this->BinaryDir)._M_dataplus._M_p);
    return;
  }
  return;
}

Assistant:

void cmCTestScriptHandler::RestoreBackupDirectories()
{
  // if we backed up the dirs and the build failed, then restore
  // the backed up dirs
  if (this->Backup) {
    // if for some reason those directories exist then first delete them
    if (cmSystemTools::FileExists(this->SourceDir)) {
      cmSystemTools::RemoveADirectory(this->SourceDir);
    }
    if (cmSystemTools::FileExists(this->BinaryDir)) {
      cmSystemTools::RemoveADirectory(this->BinaryDir);
    }
    // rename the src and binary directories
    rename(this->BackupSourceDir.c_str(), this->SourceDir.c_str());
    rename(this->BackupBinaryDir.c_str(), this->BinaryDir.c_str());
  }
}